

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdLocal.c
# Opt level: O1

DdNode * Extra_dsdRemap(DdManager *dd,DdNode *bF,st__table *pCache,int *pVar2Form,int *pForm2Var,
                       DdNode **pbCube0,DdNode **pbCube1)

{
  st__table *bF_00;
  int *pVar2Form_00;
  int *pForm2Var_00;
  int iVar1;
  long lVar2;
  DdNode *n;
  uint *puVar3;
  DdNode *pDVar4;
  DdNode *bRes;
  DdNode *local_68;
  st__table *local_60;
  DdNode *local_58;
  DdNode **local_50;
  int *local_48;
  long local_40;
  int *local_38;
  
  puVar3 = (uint *)((ulong)bF & 0xfffffffffffffffe);
  pDVar4 = bF;
  if ((*puVar3 != 0x7fffffff) &&
     ((local_38 = pForm2Var, puVar3[1] == 1 ||
      (iVar1 = st__lookup(pCache,(char *)bF,(char **)&local_68), pDVar4 = local_68, iVar1 == 0)))) {
    lVar2 = (long)pVar2Form[*puVar3];
    local_48 = pVar2Form;
    local_40 = lVar2;
    local_58 = Extra_bddNodePointedByCube(dd,bF,pbCube0[lVar2]);
    local_50 = pbCube0;
    local_60 = (st__table *)Extra_bddNodePointedByCube(dd,bF,pbCube1[lVar2]);
    pForm2Var_00 = local_38;
    pVar2Form_00 = local_48;
    local_58 = Extra_dsdRemap(dd,local_58,pCache,local_48,local_38,local_50,pbCube1);
    Cudd_Ref(local_58);
    bF_00 = local_60;
    local_60 = pCache;
    n = Extra_dsdRemap(dd,(DdNode *)bF_00,pCache,pVar2Form_00,pForm2Var_00,local_50,pbCube1);
    Cudd_Ref(n);
    pDVar4 = local_58;
    local_68 = Cudd_bddIte(dd,dd->vars[pForm2Var_00[local_40]],n,local_58);
    Cudd_Ref(local_68);
    Cudd_RecursiveDeref(dd,pDVar4);
    Cudd_RecursiveDeref(dd,n);
    if (puVar3[1] != 1) {
      st__insert(local_60,(char *)bF,(char *)local_68);
    }
    Cudd_Deref(local_68);
    pDVar4 = local_68;
  }
  return pDVar4;
}

Assistant:

DdNode * Extra_dsdRemap( DdManager * dd, DdNode * bF, st__table * pCache,
    int * pVar2Form, int * pForm2Var, DdNode * pbCube0[], DdNode * pbCube1[] )
{
    DdNode * bFR, * bF0, * bF1;
    DdNode * bRes0, * bRes1, * bRes;
    int iForm;
    
    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return bF;

    // check the hash-table
    if ( bFR->ref != 1 )
    {
        if ( st__lookup( pCache, (char *)bF, (char **)&bRes ) )
            return bRes;
    }

    // get the formal input
    iForm = pVar2Form[bFR->index];

    // get the nodes pointed to by the cube
    bF0 = Extra_bddNodePointedByCube( dd, bF, pbCube0[iForm] );
    bF1 = Extra_bddNodePointedByCube( dd, bF, pbCube1[iForm] );

    // call recursively for these nodes
    bRes0 = Extra_dsdRemap( dd, bF0, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes0 );
    bRes1 = Extra_dsdRemap( dd, bF1, pCache, pVar2Form, pForm2Var, pbCube0, pbCube1 ); Cudd_Ref( bRes1 );

    // derive the result using ITE
    bRes = Cudd_bddIte( dd, dd->vars[ pForm2Var[iForm] ], bRes1, bRes0 ); Cudd_Ref( bRes );
    Cudd_RecursiveDeref( dd, bRes0 );
    Cudd_RecursiveDeref( dd, bRes1 );

    // add to the hash table
    if ( bFR->ref != 1 )
        st__insert( pCache, (char *)bF, (char *)bRes );
    Cudd_Deref( bRes );
    return bRes;
}